

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::TSPI_PDU::SetSystemSpecificData(TSPI_PDU *this,KOCTET *Data,KUINT8 Length)

{
  byte local_1a;
  KUINT8 i;
  KUINT8 Length_local;
  KOCTET *Data_local;
  TSPI_PDU *this_local;
  
  ClearSystemSpecificData(this);
  SetSystemSpecificDataFlag(this,true);
  std::vector<char,_std::allocator<char>_>::clear(&this->m_vSSD);
  for (local_1a = 0; local_1a < Length; local_1a = local_1a + 1) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vSSD,Data + local_1a);
  }
  this->m_ui8SSDLen = Length;
  (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
       (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + (ushort)Length;
  return;
}

Assistant:

void TSPI_PDU::SetSystemSpecificData( const KOCTET * Data, KUINT8 Length )
{
    ClearSystemSpecificData();
    SetSystemSpecificDataFlag( true );
    m_vSSD.clear();

    for( KUINT8 i = 0; i < Length; ++i )
    {
        m_vSSD.push_back( Data[i] );
    }

    m_ui8SSDLen = Length;

    // Set the new pdu length
    m_ui16PDULength += Length;
}